

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::CaseDepends(TestResponseProxy *this,char *caseName,char *dependencyList)

{
  Ref testModule;
  allocator<char> local_6a;
  allocator<char> local_69;
  TestModule *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string local_58;
  string local_38;
  
  TestRunner::GetCurrentTestModule();
  if (local_68 != (TestModule *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,caseName,&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,dependencyList,&local_6a)
    ;
    TestModule::AddDependencyForCase(local_68,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return;
}

Assistant:

void TestResponseProxy::CaseDepends(const char *caseName, const char *dependencyList) {
    auto testModule = TestRunner::GetCurrentTestModule();
    if (testModule != nullptr) {
        testModule->AddDependencyForCase(caseName, dependencyList);
    }
}